

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_obj.c
# Opt level: O0

void do_value(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  CHAR_DATA *obj_00;
  CHAR_DATA *ch_00;
  long lVar3;
  long in_RDI;
  int cost;
  OBJ_DATA *obj;
  CHAR_DATA *keeper;
  char arg [4608];
  char buf [4608];
  char *in_stack_ffffffffffffdbc8;
  undefined4 in_stack_ffffffffffffdbd0;
  undefined4 in_stack_ffffffffffffdbd4;
  CHAR_DATA *in_stack_ffffffffffffdbd8;
  char *in_stack_ffffffffffffdbe0;
  char in_stack_ffffffffffffdbe8;
  undefined7 in_stack_ffffffffffffdbe9;
  OBJ_DATA *in_stack_ffffffffffffdc00;
  CHAR_DATA *in_stack_ffffffffffffdc08;
  CHAR_DATA *in_stack_ffffffffffffedd8;
  char *in_stack_ffffffffffffede0;
  CHAR_DATA *in_stack_ffffffffffffede8;
  
  one_argument((char *)CONCAT44(in_stack_ffffffffffffdbd4,in_stack_ffffffffffffdbd0),
               in_stack_ffffffffffffdbc8);
  if (in_stack_ffffffffffffdbe8 == '\0') {
    send_to_char(in_stack_ffffffffffffdbe0,in_stack_ffffffffffffdbd8);
  }
  else {
    obj_00 = find_keeper(in_stack_ffffffffffffdbd8);
    if (obj_00 != (CHAR_DATA *)0x0) {
      ch_00 = (CHAR_DATA *)
              get_obj_carry(in_stack_ffffffffffffede8,in_stack_ffffffffffffede0,
                            in_stack_ffffffffffffedd8);
      if (ch_00 == (CHAR_DATA *)0x0) {
        act((char *)obj_00,(CHAR_DATA *)0x0,
            (void *)CONCAT44(in_stack_ffffffffffffdbd4,in_stack_ffffffffffffdbd0),
            in_stack_ffffffffffffdbc8,0);
        *(CHAR_DATA **)(in_RDI + 0x28) = obj_00;
      }
      else {
        bVar1 = can_see_obj(in_stack_ffffffffffffdc08,in_stack_ffffffffffffdc00);
        if (bVar1) {
          bVar1 = can_drop_obj(ch_00,(OBJ_DATA *)
                                     CONCAT44(in_stack_ffffffffffffdbd4,in_stack_ffffffffffffdbd0));
          if (bVar1) {
            lVar3 = get_cost((CHAR_DATA *)
                             CONCAT71(in_stack_ffffffffffffdbe9,in_stack_ffffffffffffdbe8),
                             (OBJ_DATA *)obj_00,SUB81((ulong)ch_00 >> 0x38,0));
            iVar2 = (int)lVar3;
            if (iVar2 < 1) {
              act((char *)obj_00,ch_00,(void *)CONCAT44(iVar2,in_stack_ffffffffffffdbd0),
                  in_stack_ffffffffffffdbc8,0);
            }
            else {
              sprintf(&stack0xffffffffffffede8,
                      "$n tells you \'I\'ll give you %d gold coins for $p.\'",
                      (long)iVar2 / 100 & 0xffffffff);
              act((char *)obj_00,ch_00,(void *)CONCAT44(iVar2,in_stack_ffffffffffffdbd0),
                  in_stack_ffffffffffffdbc8,0);
              *(CHAR_DATA **)(in_RDI + 0x28) = obj_00;
            }
          }
          else {
            send_to_char((char *)obj_00,ch_00);
          }
        }
        else {
          act((char *)obj_00,ch_00,
              (void *)CONCAT44(in_stack_ffffffffffffdbd4,in_stack_ffffffffffffdbd0),
              in_stack_ffffffffffffdbc8,0);
        }
      }
    }
  }
  return;
}

Assistant:

void do_value(CHAR_DATA *ch, char *argument)
{
	char buf[MAX_STRING_LENGTH];
	char arg[MAX_INPUT_LENGTH];
	CHAR_DATA *keeper;
	OBJ_DATA *obj;
	int cost;

	one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		send_to_char("Value what?\n\r", ch);
		return;
	}

	keeper = find_keeper(ch);

	if (keeper == nullptr)
		return;

	obj = get_obj_carry(ch, arg, ch);

	if (obj == nullptr)
	{
		act("$n tells you 'You don't have that item'.", keeper, nullptr, ch, TO_VICT);
		ch->reply = keeper;
		return;
	}

	if (!can_see_obj(keeper, obj))
	{
		act("$n doesn't see what you are offering.", keeper, nullptr, ch, TO_VICT);
		return;
	}

	if (!can_drop_obj(ch, obj))
	{
		send_to_char("You can't let go of it.\n\r", ch);
		return;
	}

	cost = get_cost(keeper, obj, false);

	if (cost <= 0)
	{
		act("$n looks uninterested in $p.", keeper, obj, ch, TO_VICT);
		return;
	}

	sprintf(buf, "$n tells you 'I'll give you %d gold coins for $p.'", cost / 100);
	act(buf, keeper, obj, ch, TO_VICT);

	ch->reply = keeper;
}